

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O1

uint Assimp::StandardShapes::MakeHexahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions,
               bool polygons)

{
  pointer *ppaVar1;
  uint uVar2;
  undefined8 uVar3;
  aiVector3t<float> *paVar4;
  aiVector3t<float> *paVar5;
  aiVector3t<float> *__args;
  undefined7 in_register_00000031;
  iterator iVar6;
  aiVector3t<float> local_98;
  aiVector3t<float> local_88;
  aiVector3t<float> local_78;
  aiVector3t<float> local_68;
  aiVector3t<float> local_58;
  aiVector3t<float> local_48;
  aiVector3t<float> local_38;
  aiVector3t<float> local_28;
  
  paVar5 = &local_98;
  __args = &local_98;
  ppaVar1 = &(positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 0x24);
  local_88.x = -0.57735026;
  local_88.y = -0.57735026;
  local_88.z = -0.57735026;
  local_28.x = 0.57735026;
  local_28.y = -0.57735026;
  local_28.z = -0.57735026;
  local_38.x = 0.57735026;
  local_38.y = 0.57735026;
  local_38.z = -0.57735026;
  local_48.x = -0.57735026;
  local_48.y = 0.57735026;
  local_48.z = -0.57735026;
  local_58.x = -0.57735026;
  local_58.y = -0.57735026;
  local_58.z = 0.57735026;
  local_68.x = 0.57735026;
  local_68.y = -0.57735026;
  local_68.z = 0.57735026;
  local_98.x = 0.57735026;
  local_98.y = 0.57735026;
  local_98.z = 0.57735026;
  local_78.x = -0.57735026;
  local_78.y = 0.57735026;
  local_78.z = 0.57735026;
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  paVar4 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((int)CONCAT71(in_register_00000031,polygons) == 0) {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_88);
    }
    else {
      (iVar6._M_current)->z = -0.57735026;
      (iVar6._M_current)->x = -0.57735026;
      (iVar6._M_current)->y = -0.57735026;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_48);
    }
    else {
      (iVar6._M_current)->z = local_48.z;
      (iVar6._M_current)->x = local_48.x;
      (iVar6._M_current)->y = local_48.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_38);
    }
    else {
      (iVar6._M_current)->z = local_38.z;
      (iVar6._M_current)->x = local_38.x;
      (iVar6._M_current)->y = local_38.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current !=
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar6._M_current)->z = local_88.z;
      uVar3 = local_88._0_8_;
      goto LAB_00697751;
    }
    paVar4 = &local_88;
LAB_0069775f:
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,paVar4
              );
  }
  else {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_88);
    }
    else {
      (iVar6._M_current)->z = -0.57735026;
      (iVar6._M_current)->x = -0.57735026;
      (iVar6._M_current)->y = -0.57735026;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      paVar4 = &local_48;
      goto LAB_0069775f;
    }
    (iVar6._M_current)->z = local_48.z;
    uVar3 = local_48._0_8_;
LAB_00697751:
    (iVar6._M_current)->x = (float)uVar3;
    (iVar6._M_current)->y = SUB84(uVar3,4);
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_38);
  }
  else {
    (iVar6._M_current)->z = local_38.z;
    (iVar6._M_current)->x = local_38.x;
    (iVar6._M_current)->y = local_38.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_28);
  }
  else {
    (iVar6._M_current)->z = local_28.z;
    (iVar6._M_current)->x = local_28.x;
    (iVar6._M_current)->y = local_28.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  paVar4 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (polygons) {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_88);
    }
    else {
      (iVar6._M_current)->z = local_88.z;
      (iVar6._M_current)->x = local_88.x;
      (iVar6._M_current)->y = local_88.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      paVar4 = &local_28;
      goto LAB_006978b8;
    }
    (iVar6._M_current)->z = local_28.z;
    uVar3 = local_28._0_8_;
LAB_006978aa:
    (iVar6._M_current)->x = (float)uVar3;
    (iVar6._M_current)->y = SUB84(uVar3,4);
    *ppaVar1 = *ppaVar1 + 1;
  }
  else {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_88);
    }
    else {
      (iVar6._M_current)->z = local_88.z;
      (iVar6._M_current)->x = local_88.x;
      (iVar6._M_current)->y = local_88.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_28);
    }
    else {
      (iVar6._M_current)->z = local_28.z;
      (iVar6._M_current)->x = local_28.x;
      (iVar6._M_current)->y = local_28.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_68);
    }
    else {
      (iVar6._M_current)->z = local_68.z;
      (iVar6._M_current)->x = local_68.x;
      (iVar6._M_current)->y = local_68.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current !=
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar6._M_current)->z = local_88.z;
      uVar3 = local_88._0_8_;
      goto LAB_006978aa;
    }
    paVar4 = &local_88;
LAB_006978b8:
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,paVar4
              );
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_68);
  }
  else {
    (iVar6._M_current)->z = local_68.z;
    (iVar6._M_current)->x = local_68.x;
    (iVar6._M_current)->y = local_68.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_58);
  }
  else {
    (iVar6._M_current)->z = local_58.z;
    (iVar6._M_current)->x = local_58.x;
    (iVar6._M_current)->y = local_58.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  paVar4 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (polygons) {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_88);
    }
    else {
      (iVar6._M_current)->z = local_88.z;
      (iVar6._M_current)->x = local_88.x;
      (iVar6._M_current)->y = local_88.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      paVar4 = &local_58;
      goto LAB_00697a11;
    }
    (iVar6._M_current)->z = local_58.z;
    uVar3 = local_58._0_8_;
LAB_00697a03:
    (iVar6._M_current)->x = (float)uVar3;
    (iVar6._M_current)->y = SUB84(uVar3,4);
    *ppaVar1 = *ppaVar1 + 1;
  }
  else {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_88);
    }
    else {
      (iVar6._M_current)->z = local_88.z;
      (iVar6._M_current)->x = local_88.x;
      (iVar6._M_current)->y = local_88.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_58);
    }
    else {
      (iVar6._M_current)->z = local_58.z;
      (iVar6._M_current)->x = local_58.x;
      (iVar6._M_current)->y = local_58.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_78);
    }
    else {
      (iVar6._M_current)->z = local_78.z;
      (iVar6._M_current)->x = local_78.x;
      (iVar6._M_current)->y = local_78.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current !=
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar6._M_current)->z = local_88.z;
      uVar3 = local_88._0_8_;
      goto LAB_00697a03;
    }
    paVar4 = &local_88;
LAB_00697a11:
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,paVar4
              );
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_78);
  }
  else {
    (iVar6._M_current)->z = local_78.z;
    (iVar6._M_current)->x = local_78.x;
    (iVar6._M_current)->y = local_78.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_48);
  }
  else {
    (iVar6._M_current)->z = local_48.z;
    (iVar6._M_current)->x = local_48.x;
    (iVar6._M_current)->y = local_48.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  paVar4 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (polygons) {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_98);
    }
    else {
      (iVar6._M_current)->z = local_98.z;
      (iVar6._M_current)->x = local_98.x;
      (iVar6._M_current)->y = local_98.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      paVar5 = &local_68;
      goto LAB_00697b5e;
    }
    (iVar6._M_current)->z = local_68.z;
    uVar3 = local_68._0_8_;
LAB_00697b52:
    (iVar6._M_current)->x = (float)uVar3;
    (iVar6._M_current)->y = SUB84(uVar3,4);
    *ppaVar1 = *ppaVar1 + 1;
  }
  else {
    if (iVar6._M_current == paVar4) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_98);
    }
    else {
      (iVar6._M_current)->z = local_98.z;
      (iVar6._M_current)->x = local_98.x;
      (iVar6._M_current)->y = local_98.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_68);
    }
    else {
      (iVar6._M_current)->z = local_68.z;
      (iVar6._M_current)->x = local_68.x;
      (iVar6._M_current)->y = local_68.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_28);
    }
    else {
      (iVar6._M_current)->z = local_28.z;
      (iVar6._M_current)->x = local_28.x;
      (iVar6._M_current)->y = local_28.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current !=
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar6._M_current)->z = local_98.z;
      uVar3 = local_98._0_8_;
      goto LAB_00697b52;
    }
LAB_00697b5e:
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,paVar5
              );
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_28);
  }
  else {
    (iVar6._M_current)->z = local_28.z;
    (iVar6._M_current)->x = local_28.x;
    (iVar6._M_current)->y = local_28.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_38);
  }
  else {
    (iVar6._M_current)->z = local_38.z;
    (iVar6._M_current)->x = local_38.x;
    (iVar6._M_current)->y = local_38.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  paVar5 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (polygons) {
    if (iVar6._M_current == paVar5) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_98);
    }
    else {
      (iVar6._M_current)->z = local_98.z;
      (iVar6._M_current)->x = local_98.x;
      (iVar6._M_current)->y = local_98.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      __args = &local_38;
LAB_00697cab:
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 __args);
      goto LAB_00697cb3;
    }
    (iVar6._M_current)->z = local_38.z;
    uVar3 = local_38._0_8_;
  }
  else {
    if (iVar6._M_current == paVar5) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_98);
    }
    else {
      (iVar6._M_current)->z = local_98.z;
      (iVar6._M_current)->x = local_98.x;
      (iVar6._M_current)->y = local_98.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_38);
    }
    else {
      (iVar6._M_current)->z = local_38.z;
      (iVar6._M_current)->x = local_38.x;
      (iVar6._M_current)->y = local_38.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_48);
    }
    else {
      (iVar6._M_current)->z = local_48.z;
      (iVar6._M_current)->x = local_48.x;
      (iVar6._M_current)->y = local_48.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00697cab;
    (iVar6._M_current)->z = local_98.z;
    uVar3 = local_98._0_8_;
  }
  (iVar6._M_current)->x = (float)uVar3;
  (iVar6._M_current)->y = SUB84(uVar3,4);
  *ppaVar1 = *ppaVar1 + 1;
LAB_00697cb3:
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_48);
  }
  else {
    (iVar6._M_current)->z = local_48.z;
    (iVar6._M_current)->x = local_48.x;
    (iVar6._M_current)->y = local_48.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
               &local_78);
  }
  else {
    (iVar6._M_current)->z = local_78.z;
    (iVar6._M_current)->x = local_78.x;
    (iVar6._M_current)->y = local_78.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar6._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  paVar5 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (polygons) {
    if (iVar6._M_current == paVar5) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_98);
    }
    else {
      (iVar6._M_current)->z = local_98.z;
      (iVar6._M_current)->x = local_98.x;
      (iVar6._M_current)->y = local_98.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_78);
    }
    else {
      (iVar6._M_current)->z = local_78.z;
      (iVar6._M_current)->x = local_78.x;
      (iVar6._M_current)->y = local_78.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_58);
    }
    else {
      (iVar6._M_current)->z = local_58.z;
      (iVar6._M_current)->x = local_58.x;
      (iVar6._M_current)->y = local_58.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_68);
    }
    else {
      (iVar6._M_current)->z = local_68.z;
      (iVar6._M_current)->x = local_68.x;
      (iVar6._M_current)->y = local_68.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    uVar2 = 4;
  }
  else {
    if (iVar6._M_current == paVar5) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_98);
    }
    else {
      (iVar6._M_current)->z = local_98.z;
      (iVar6._M_current)->x = local_98.x;
      (iVar6._M_current)->y = local_98.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_78);
    }
    else {
      (iVar6._M_current)->z = local_78.z;
      (iVar6._M_current)->x = local_78.x;
      (iVar6._M_current)->y = local_78.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_58);
    }
    else {
      (iVar6._M_current)->z = local_58.z;
      (iVar6._M_current)->x = local_58.x;
      (iVar6._M_current)->y = local_58.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_98);
    }
    else {
      (iVar6._M_current)->z = local_98.z;
      (iVar6._M_current)->x = local_98.x;
      (iVar6._M_current)->y = local_98.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_58);
    }
    else {
      (iVar6._M_current)->z = local_58.z;
      (iVar6._M_current)->x = local_58.x;
      (iVar6._M_current)->y = local_58.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6._M_current =
         (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar6,
                 &local_68);
    }
    else {
      (iVar6._M_current)->z = local_68.z;
      (iVar6._M_current)->x = local_68.x;
      (iVar6._M_current)->y = local_68.y;
      *ppaVar1 = *ppaVar1 + 1;
    }
    uVar2 = 3;
  }
  return uVar2;
}

Assistant:

unsigned int StandardShapes::MakeHexahedron(std::vector<aiVector3D>& positions,
    bool polygons /*= false*/)
{
    positions.reserve(positions.size()+36);
    const ai_real length = ai_real(1.0)/ai_real(1.73205080);

    const aiVector3D v0  = aiVector3D(-1.0,-1.0,-1.0)*length;
    const aiVector3D v1  = aiVector3D(1.0,-1.0,-1.0)*length;
    const aiVector3D v2  = aiVector3D(1.0,1.0,-1.0)*length;
    const aiVector3D v3  = aiVector3D(-1.0,1.0,-1.0)*length;
    const aiVector3D v4  = aiVector3D(-1.0,-1.0,1.0)*length;
    const aiVector3D v5  = aiVector3D(1.0,-1.0,1.0)*length;
    const aiVector3D v6  = aiVector3D(1.0,1.0,1.0)*length;
    const aiVector3D v7  = aiVector3D(-1.0,1.0,1.0)*length;

    ADD_QUAD(v0,v3,v2,v1);
    ADD_QUAD(v0,v1,v5,v4);
    ADD_QUAD(v0,v4,v7,v3);
    ADD_QUAD(v6,v5,v1,v2);
    ADD_QUAD(v6,v2,v3,v7);
    ADD_QUAD(v6,v7,v4,v5);
    return (polygons ? 4 : 3);
}